

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutTests.cpp
# Opt level: O1

TestCaseGroup * vkt::ssbo::createTests(TestContext *testCtx)

{
  TestNode *this;
  TestNode *node;
  
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,testCtx,"ssbo","Shader Storage Buffer Object Tests");
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)node,testCtx,"layout","SSBO Layout Tests");
  node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d5f410;
  tcu::TestNode::addChild(this,node);
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> ssboTestGroup (new tcu::TestCaseGroup(testCtx, "ssbo", "Shader Storage Buffer Object Tests"));

	ssboTestGroup->addChild(new SSBOLayoutTests(testCtx));

	return ssboTestGroup.release();
}